

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O3

void __thiscall
TasGrid::TasmanianSparseGrid::getNeededPoints
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x)

{
  BaseCanonicalGrid *pBVar1;
  size_type __new_size;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    __new_size = 0;
  }
  else {
    __new_size = (long)*(int *)(pBVar1 + 0x48) * (long)*(int *)(pBVar1 + 0x10);
  }
  std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
  TasGrid::TasmanianSparseGrid::getNeededPoints((double *)this);
  return;
}

Assistant:

void getNeededPoints(std::vector<double> &x) const{ x.resize(Utils::size_mult(getNumDimensions(), getNumNeeded())); getNeededPoints(x.data()); }